

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LoudnessMeter.cpp
# Opt level: O0

int LoudnessMeter::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  EffectData *pEVar1;
  uint local_44;
  float *pfStack_40;
  uint n;
  float *src;
  EffectData *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<LoudnessMeter::EffectData>(state);
  memcpy(outbuffer,inbuffer,(ulong)length * 4 * (long)inchannels);
  pfStack_40 = inbuffer;
  for (local_44 = 0; local_44 < length; local_44 = local_44 + 1) {
    LoudnessAnalyzer::Feed(&pEVar1->momentary,pfStack_40,inchannels);
    LoudnessAnalyzer::Feed(&pEVar1->shortterm,pfStack_40,inchannels);
    LoudnessAnalyzer::Feed(&pEVar1->integrated,pfStack_40,inchannels);
    pfStack_40 = pfStack_40 + inchannels;
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        memcpy(outbuffer, inbuffer, sizeof(float) * length * inchannels);

        const float* src = inbuffer;
        for (unsigned int n = 0; n < length; n++)
        {
            data->momentary.Feed(src, inchannels);
            data->shortterm.Feed(src, inchannels);
            data->integrated.Feed(src, inchannels);
            src += inchannels;
        }

        return UNITY_AUDIODSP_OK;
    }